

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
diy::RegularLink<diy::Bounds<int>_>::load(RegularLink<diy::Bounds<int>_> *this,BinaryBuffer *bb)

{
  Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::load
            (bb,&(this->super_Registrar<diy::RegularLink<diy::Bounds<int>_>_>).super_Link.neighbors_
            );
  (*bb->_vptr_BinaryBuffer[4])(bb,&this->dim_,4);
  Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
  ::load(bb,&this->dir_map_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
            (bb,&this->dir_vec_);
  Serialization<diy::Bounds<int>_>::load(bb,&this->core_);
  Serialization<diy::Bounds<int>_>::load(bb,&this->bounds_);
  Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::load
            (bb,&this->nbr_cores_);
  Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::load
            (bb,&this->nbr_bounds_);
  Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
            (bb,&this->wrap_);
  return;
}

Assistant:

void      load(BinaryBuffer& bb) override
      {
          Link::load(bb);
          diy::load(bb, dim_);
          diy::load(bb, dir_map_);
          diy::load(bb, dir_vec_);
          diy::load(bb, core_);
          diy::load(bb, bounds_);
          diy::load(bb, nbr_cores_);
          diy::load(bb, nbr_bounds_);
          diy::load(bb, wrap_);
      }